

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O0

ClauseIterator __thiscall
Inferences::FunctionDefinitionRewriting::generateClauses
          (FunctionDefinitionRewriting *this,Clause *premise)

{
  Clause *in_RSI;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  undefined1 local_160 [24];
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  local_148;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>_>
  *in_stack_fffffffffffffed8;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  *in_stack_ffffffffffffff10;
  anon_class_8_1_705f00f1_for__func in_stack_ffffffffffffff18;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>_>
  *in_stack_ffffffffffffff20;
  anon_class_8_1_8991fb9c_for__func in_stack_ffffffffffffff28;
  undefined1 local_d0 [80];
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>_>
  local_80;
  
  Kernel::Clause::iterLits(in_RSI);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>
  ::flatMap<Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__0>
            (&local_148,local_160);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::$_0,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::Term*>>>>>
  ::flatMap<Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__1>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::$_0,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::Term*>>>>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::$_1,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::Term*>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>>
  ::map<Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__2>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>_>
  ::filter<Lib::NonzeroFn>(&local_80,local_d0);
  Lib::
  pvi<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__0,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::Term*>>>>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__1,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::Term*>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::FunctionDefinitionRewriting::generateClauses(Kernel::Clause*)::__2,Kernel::Clause*>,Lib::NonzeroFn,false>>>
            (in_stack_fffffffffffffed8);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>_>
                 *)0x7bba86);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>_>
                 *)0x7bba93);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
                 *)0x7bbaa0);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>_>
                 *)0x7bbaaa);
  return (ClauseIterator)in_RDI;
}

Assistant:

Kernel::ClauseIterator FunctionDefinitionRewriting::generateClauses(Clause *premise)
{
  return pvi(premise->iterLits()
    .flatMap([](Literal *lit) {
      NonVariableNonTypeIterator nvi(lit);
      return pvi(pushPairIntoRightIterator(lit, getUniquePersistentIteratorFromPtr(&nvi)));
    })
    .flatMap([this](std::pair<Literal*, Term*> arg){
      return pvi(pushPairIntoRightIterator(arg,
        GeneratingInferenceEngine::_salg->getFunctionDefinitionHandler().getGeneralizations(arg.second)));
    })
    .map([premise](auto arg) {
      auto &qr = arg.second;
      bool temp;
      return (Clause*)performRewriting(premise, arg.first.first, TermList(arg.first.second), qr.data->clause,
        qr.data->literal, qr.data->term, qr.unifier, nullptr, temp,
        Inference(GeneratingInference2(InferenceRule::FUNCTION_DEFINITION_REWRITING, premise, qr.data->clause)));
    })
    .filter(NonzeroFn()));
}